

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::DestroyString(void *s)

{
  std::__cxx11::string::~string((string *)s);
  return;
}

Assistant:

void DestroyString(const void* s) {
  static_cast<const std::string*>(s)->~basic_string();
}